

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PArena.cpp
# Opt level: O3

void __thiscall amrex::PArena::PArena(PArena *this,Long release_threshold)

{
  (this->super_Arena).arena_info.release_threshold = 0x7fffffffffffffff;
  (this->super_Arena).arena_info.use_cpu_memory = false;
  (this->super_Arena).arena_info.device_use_managed_memory = true;
  (this->super_Arena).arena_info.device_set_readonly = false;
  (this->super_Arena).arena_info.device_set_preferred = false;
  (this->super_Arena).arena_info.device_use_hostalloc = false;
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__PArena_0080cc78;
  return;
}

Assistant:

PArena::PArena (Long release_threshold)
{
#ifdef AMREX_CUDA_GE_11_2
    if (Gpu::Device::memoryPoolsSupported()) {
        AMREX_CUDA_SAFE_CALL(cudaDeviceGetMemPool(&m_pool, Gpu::Device::deviceId()));
        AMREX_CUDA_SAFE_CALL(cudaMemPoolGetAttribute(m_pool, cudaMemPoolAttrReleaseThreshold,
                                                     &m_old_release_threshold));
        cuuint64_t value = release_threshold;
        AMREX_CUDA_SAFE_CALL(cudaMemPoolSetAttribute(m_pool, cudaMemPoolAttrReleaseThreshold, &value));
    }
#endif
    amrex::ignore_unused(release_threshold);
}